

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O1

Type __thiscall
wasm::anon_unknown_24::HeapTypeGeneratorImpl::generateSupertype
          (HeapTypeGeneratorImpl *this,Type type)

{
  __index_type _Var1;
  pointer pvVar2;
  uint32_t uVar3;
  Shareability SVar4;
  uint uVar5;
  size_t __n;
  Type *pTVar6;
  iterator iVar7;
  _Optional_payload_base<unsigned_int> _Var8;
  value_type *pvVar9;
  HeapType HVar10;
  uintptr_t *puVar11;
  uintptr_t uVar12;
  Exactness EVar13;
  Nullability NVar14;
  Type local_78;
  Type type_local;
  undefined1 local_68 [8];
  Iterator __begin3;
  vector<wasm::Type,_std::allocator<wasm::Type>_> types;
  HeapType local_38;
  
  local_78.id = type.id;
  if ((type.id & 1) != 0 && 6 < type.id) {
    __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
    types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    __n = Type::size(&local_78);
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::reserve
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)
               &__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index,
               __n);
    __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)0x0;
    local_68 = (undefined1  [8])&local_78;
    pTVar6 = (Type *)Type::size(&local_78);
    if (__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent ==
        pTVar6) goto LAB_00183032;
    do {
      do {
        puVar11 = (uintptr_t *)wasm::Type::Iterator::operator*((Iterator *)local_68);
        local_38.id = (uintptr_t)generateSupertype(this,*puVar11);
        if (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_start == (pointer)0x0) {
          std::vector<wasm::Type,_std::allocator<wasm::Type>_>::_M_realloc_insert<wasm::Type>
                    ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)
                     &__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                      index,(iterator)0x0,(Type *)&local_38);
        }
        else {
          (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_start)->id = local_38.id;
          types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start =
               types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
        __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)((long)&(__begin3.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                             parent)->id + 1);
      } while (__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
               != pTVar6);
LAB_00183032:
    } while (local_68 != (undefined1  [8])&local_78);
    uVar12 = wasm::TypeBuilder::getTempTupleType(this->builder);
    if (__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index == 0) {
      return (Type)uVar12;
    }
    operator_delete((void *)__begin3.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                            index,
                    -__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                     index);
    return (Type)uVar12;
  }
  if ((type.id & 1) != 0 || type.id < 7) {
    if (type.id < 7) {
      return (Type)type.id;
    }
    wasm::handle_unreachable
              ("unexpected type kind",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
               ,0x253);
  }
  local_68 = (undefined1  [8])Type::getHeapType(&local_78);
  EVar13 = Exact;
  if (local_78.id < 7 || ((uint)local_78.id & 3) != 2) {
    uVar3 = Random::upTo(this->rand,2);
    EVar13 = (Exactness)(uVar3 == 0);
  }
  SVar4 = wasm::HeapType::getShared();
  __begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
  types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  iVar7 = std::
          _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->typeIndices)._M_h,(key_type *)local_68);
  if (iVar7.super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>._M_cur !=
      (__node_type *)0x0) {
    _Var8._4_4_ = 0;
    _Var8._M_payload._M_value =
         *(uint *)((long)iVar7.
                         super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                         ._M_cur + 0x10);
    type_local.id._0_4_ = EVar13;
    type_local.id._4_4_ = SVar4;
    do {
      local_38.id = wasm::TypeBuilder::getTempHeapType((ulong)this->builder);
      if (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start == (pointer)0x0) {
        std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::
        _M_realloc_insert<wasm::HeapType>
                  ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                   &__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                    index,(iterator)0x0,&local_38);
      }
      else {
        (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
         super__Vector_impl_data._M_start)->id = local_38.id;
        types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start =
             types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      }
      SVar4 = type_local.id._4_4_;
      EVar13 = (Exactness)type_local.id;
      _Var8 = *(_Optional_payload_base<unsigned_int> *)
               ((this->supertypeIndices).
                super__Vector_base<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start + ((ulong)_Var8 & 0xffffffff));
    } while (((ulong)_Var8 >> 0x20 & 1) != 0);
    pvVar2 = (this->typeKinds).
             super__Vector_base<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>,_std::allocator<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pvVar2 == (pointer)0x0) {
LAB_00182f50:
      wasm::handle_unreachable
                ("unexpected kind",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                 ,0x1ed);
    }
    _Var1 = *(__index_type *)
             ((long)&pvVar2[*(uint *)((long)iVar7.
                                            super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                                            ._M_cur + 0x10)].
                     super__Variant_base<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
                     .
                     super__Move_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
                     .
                     super__Copy_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
             + 1);
    if (_Var1 == '\0') {
      local_38.id = (ulong)(type_local.id._4_4_ == Shared) * 4 + 0x10;
      if (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start == (pointer)0x0) {
        std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::
        _M_realloc_insert<wasm::HeapType>
                  ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                   &__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                    index,(iterator)0x0,&local_38);
      }
      else {
LAB_00182db1:
        (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
         super__Vector_impl_data._M_start)->id = local_38.id;
      }
    }
    else if (_Var1 == '\x01') {
      local_38.id = (ulong)(type_local.id._4_4_ == Shared) * 4 + 0x38;
      if (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start == (pointer)0x0) {
        std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::
        _M_realloc_insert<wasm::HeapType>
                  ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                   &__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                    index,(iterator)0x0,&local_38);
      }
      else {
        (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
         super__Vector_impl_data._M_start)->id = local_38.id;
        types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start =
             types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      }
      local_38.id = (ulong)(SVar4 == Shared) * 4 + 0x28;
      if (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start == (pointer)0x0) {
        std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::
        _M_realloc_insert<wasm::HeapType>
                  ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                   &__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                    index,(iterator)0x0,&local_38);
      }
      else {
        (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
         super__Vector_impl_data._M_start)->id = local_38.id;
        types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start =
             types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      }
      local_38.id = (ulong)(SVar4 == Shared) * 4 + 0x20;
      if (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) goto LAB_00182db1;
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::
      _M_realloc_insert<wasm::HeapType>
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                 &__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                 ,(iterator)0x0,&local_38);
    }
    else {
      if (_Var1 != '\x02') goto LAB_00182f50;
      local_38.id = (ulong)(type_local.id._4_4_ == Shared) * 4 + 0x40;
      if (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start == (pointer)0x0) {
        std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::
        _M_realloc_insert<wasm::HeapType>
                  ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                   &__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                    index,(iterator)0x0,&local_38);
      }
      else {
        (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
         super__Vector_impl_data._M_start)->id = local_38.id;
        types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start =
             types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      }
      local_38.id = (ulong)(SVar4 == Shared) * 4 + 0x28;
      if (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start == (pointer)0x0) {
        std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::
        _M_realloc_insert<wasm::HeapType>
                  ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                   &__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                    index,(iterator)0x0,&local_38);
      }
      else {
        (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
         super__Vector_impl_data._M_start)->id = local_38.id;
        types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start =
             types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      }
      local_38.id = (ulong)(SVar4 == Shared) * 4 + 0x20;
      if (types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) goto LAB_00182db1;
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::
      _M_realloc_insert<wasm::HeapType>
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                 &__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                 ,(iterator)0x0,&local_38);
    }
    pvVar9 = Random::pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                       (this->rand,
                        (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &__begin3.
                         super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index);
    goto LAB_00182f10;
  }
  if (0x7c < (ulong)local_68) {
    __assert_fail("type.isBasic()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                  ,0x1f1,
                  "HeapType wasm::(anonymous namespace)::HeapTypeGeneratorImpl::pickSuperHeapType(HeapType)"
                 );
  }
  std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
  _M_realloc_insert<wasm::HeapType_const&>
            ((vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)
             &__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index,
             (iterator)0x0,(HeapType *)local_68);
  if (0x7c < (ulong)local_68) {
    __assert_fail("isBasic()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                  ,0xe2,"BasicHeapType wasm::HeapType::getBasic(Shareability) const");
  }
  uVar5 = local_68._0_4_ & 0x7b;
  switch(uVar5 << 0x1d | uVar5 - 8 >> 3) {
  case 4:
    local_38.id = (ulong)(SVar4 == Shared) * 4 + 0x20;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::_M_realloc_insert<wasm::HeapType>
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index,
               (iterator)0x0,&local_38);
    break;
  case 5:
  case 6:
  case 7:
    local_38.id = (ulong)(SVar4 == Shared) * 4 + 0x28;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::_M_realloc_insert<wasm::HeapType>
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index,
               (iterator)0x0,&local_38);
    local_38.id = (ulong)(SVar4 == Shared) * 4 + 0x20;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::_M_realloc_insert<wasm::HeapType>
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index,
               (iterator)0x0,&local_38);
    break;
  case 9:
    local_38.id = (ulong)(SVar4 == Shared) * 4 + 8;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::_M_realloc_insert<wasm::HeapType>
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index,
               (iterator)0x0,&local_38);
    break;
  case 10:
    HVar10 = pickSubAny(this,SVar4);
    NVar14 = (Nullability)HVar10.id;
    goto LAB_00182f13;
  case 0xb:
    local_38.id = (ulong)(SVar4 == Shared) * 4 + 8;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::_M_realloc_insert<wasm::HeapType>
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index,
               (iterator)0x0,&local_38);
    break;
  case 0xc:
    HVar10 = pickSubFunc(this,SVar4);
    NVar14 = (Nullability)HVar10.id;
    goto LAB_00182f13;
  case 0xd:
    wasm::handle_unreachable
              ("not implemented",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
               ,0x20b);
  case 0xe:
    local_38.id = (ulong)(SVar4 == Shared) * 4 + 0x48;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::_M_realloc_insert<wasm::HeapType>
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index,
               (iterator)0x0,&local_38);
  }
  if (__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index == 0) {
    __assert_fail("!candidates.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/heap-types.cpp"
                  ,0x213,
                  "HeapType wasm::(anonymous namespace)::HeapTypeGeneratorImpl::pickSuperHeapType(HeapType)"
                 );
  }
  pvVar9 = Random::pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                     (this->rand,
                      (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                      &__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                       index);
LAB_00182f10:
  NVar14 = (Nullability)pvVar9->id;
LAB_00182f13:
  if (__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index != 0) {
    operator_delete((void *)__begin3.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                            index,
                    -__begin3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                     index);
  }
  uVar12 = wasm::TypeBuilder::getTempRefType((HeapType)this->builder,NVar14,EVar13);
  return (Type)uVar12;
}

Assistant:

Type generateSupertype(Type type) {
    if (type.isTuple()) {
      std::vector<Type> types;
      types.reserve(type.size());
      for (auto t : type) {
        types.push_back(generateSupertype(t));
      }
      return builder.getTempTupleType(types);
    } else if (type.isRef()) {
      auto ref = generateSuperRef({type.getHeapType(), type.getNullability()});
      return builder.getTempRefType(ref.type, ref.nullability);
    } else if (type.isBasic()) {
      // Non-reference basic types do not have supertypes.
      return type;
    } else {
      WASM_UNREACHABLE("unexpected type kind");
    }
  }